

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase *
ResolveGenericTypeAliases
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,IntrusiveList<MatchData> aliases)

{
  IntrusiveList<TypeHandle> generics;
  IntrusiveList<MatchData> aliases_00;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<MatchData> aliases_01;
  IntrusiveList<MatchData> aliases_02;
  IntrusiveList<MatchData> aliases_03;
  IntrusiveList<MatchData> aliases_04;
  IntrusiveList<MatchData> aliases_05;
  bool bVar1;
  TypeGenericAlias *pTVar2;
  TypeRef *pTVar3;
  TypeBase *pTVar4;
  TypeArray *pTVar5;
  TypeUnsizedArray *pTVar6;
  TypeFunction *pTVar7;
  TypeHandle *pTVar8;
  TypeBase *type_00;
  TypeGenericClass *pTVar9;
  TypeBase *resolvedType;
  TypeHandle *curr_2;
  IntrusiveList<TypeHandle> types;
  bool isGeneric;
  TypeGenericClass *lhs_5;
  TypeHandle *local_c8;
  TypeHandle *curr_1;
  IntrusiveList<TypeHandle> arguments;
  TypeBase *returnType;
  TypeFunction *lhs_4;
  TypeUnsizedArray *lhs_3;
  TypeArray *lhs_2;
  TypeRef *lhs_1;
  MatchData *curr;
  TypeGenericAlias *lhs;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  IntrusiveList<MatchData> aliases_local;
  
  aliases_local.head = aliases.tail;
  ctx_local = (ExpressionContext *)aliases.head;
  aliases_local.tail = (MatchData *)type;
  if ((((type->isGeneric & 1U) != 0) &&
      (bVar1 = IntrusiveList<MatchData>::empty((IntrusiveList<MatchData> *)&ctx_local), !bVar1)) &&
     (bVar1 = isType<TypeGeneric>(type), !bVar1)) {
    pTVar2 = getType<TypeGenericAlias>(type);
    if (pTVar2 == (TypeGenericAlias *)0x0) {
      pTVar3 = getType<TypeRef>(type);
      if (pTVar3 == (TypeRef *)0x0) {
        pTVar5 = getType<TypeArray>(type);
        if (pTVar5 == (TypeArray *)0x0) {
          pTVar6 = getType<TypeUnsizedArray>(type);
          if (pTVar6 == (TypeUnsizedArray *)0x0) {
            pTVar7 = getType<TypeFunction>(type);
            if (pTVar7 == (TypeFunction *)0x0) {
              pTVar9 = getType<TypeGenericClass>(type);
              if (pTVar9 == (TypeGenericClass *)0x0) {
                anon_unknown.dwarf_8df1c::Stop(ctx,source,"ERROR: unknown generic type resolve");
                aliases_local.tail = (MatchData *)0x0;
              }
              else {
                types.tail._7_1_ = 0;
                IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&curr_2);
                for (resolvedType = (TypeBase *)(pTVar9->generics).head;
                    resolvedType != (TypeBase *)0x0;
                    resolvedType = *(TypeBase **)&resolvedType->typeID) {
                  aliases_00.tail = aliases_local.head;
                  aliases_00.head = (MatchData *)ctx_local;
                  pTVar4 = ResolveGenericTypeAliases
                                     (ctx,source,(TypeBase *)resolvedType->_vptr_TypeBase,aliases_00
                                     );
                  if (pTVar4 == ctx->typeAuto) {
                    anon_unknown.dwarf_8df1c::Stop
                              (ctx,source,"ERROR: \'auto\' type cannot be used as template argument"
                              );
                  }
                  types.tail._7_1_ = (types.tail._7_1_ & 1) != 0 || (pTVar4->isGeneric & 1U) != 0;
                  pTVar8 = ExpressionContext::get<TypeHandle>(ctx);
                  TypeHandle::TypeHandle(pTVar8,pTVar4);
                  IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&curr_2,pTVar8);
                }
                if ((types.tail._7_1_ & 1) == 0) {
                  aliases_local.tail =
                       (MatchData *)
                       CreateGenericTypeInstance
                                 (ctx,source,pTVar9->proto,(IntrusiveList<TypeHandle> *)&curr_2);
                }
                else {
                  generics.tail = types.head;
                  generics.head = curr_2;
                  aliases_local.tail =
                       (MatchData *)
                       ExpressionContext::GetGenericClassType(ctx,source,pTVar9->proto,generics);
                }
              }
            }
            else {
              arguments.tail = (TypeHandle *)ctx_local;
              aliases_02.tail = aliases_local.head;
              aliases_02.head = (MatchData *)ctx_local;
              pTVar4 = ResolveGenericTypeAliases(ctx,source,pTVar7->returnType,aliases_02);
              IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&curr_1);
              for (local_c8 = (pTVar7->arguments).head; local_c8 != (TypeHandle *)0x0;
                  local_c8 = local_c8->next) {
                pTVar8 = ExpressionContext::get<TypeHandle>(ctx);
                aliases_01.tail = aliases_local.head;
                aliases_01.head = (MatchData *)ctx_local;
                type_00 = ResolveGenericTypeAliases(ctx,source,local_c8->type,aliases_01);
                TypeHandle::TypeHandle(pTVar8,type_00);
                IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&curr_1,pTVar8);
              }
              arguments_00.tail = arguments.head;
              arguments_00.head = curr_1;
              aliases_local.tail =
                   (MatchData *)ExpressionContext::GetFunctionType(ctx,source,pTVar4,arguments_00);
            }
          }
          else {
            aliases_03.tail = aliases_local.head;
            aliases_03.head = (MatchData *)ctx_local;
            pTVar4 = ResolveGenericTypeAliases(ctx,source,pTVar6->subType,aliases_03);
            aliases_local.tail = (MatchData *)ExpressionContext::GetUnsizedArrayType(ctx,pTVar4);
          }
        }
        else {
          aliases_04.tail = aliases_local.head;
          aliases_04.head = (MatchData *)ctx_local;
          pTVar4 = ResolveGenericTypeAliases(ctx,source,pTVar5->subType,aliases_04);
          aliases_local.tail =
               (MatchData *)ExpressionContext::GetArrayType(ctx,pTVar4,pTVar5->length);
        }
      }
      else {
        aliases_05.tail = aliases_local.head;
        aliases_05.head = (MatchData *)ctx_local;
        pTVar4 = ResolveGenericTypeAliases(ctx,source,pTVar3->subType,aliases_05);
        aliases_local.tail = (MatchData *)ExpressionContext::GetReferenceType(ctx,pTVar4);
      }
    }
    else {
      for (lhs_1 = (TypeRef *)ctx_local; lhs_1 != (TypeRef *)0x0;
          lhs_1 = (TypeRef *)(lhs_1->super_TypeBase).name.begin) {
        bVar1 = InplaceStr::operator==
                          ((InplaceStr *)((lhs_1->super_TypeBase)._vptr_TypeBase + 8),
                           &pTVar2->baseName->name);
        if (bVar1) {
          return *(TypeBase **)&(lhs_1->super_TypeBase).typeID;
        }
      }
      aliases_local.tail = (MatchData *)ctx->typeGeneric;
    }
  }
  return (TypeBase *)aliases_local.tail;
}

Assistant:

TypeBase* ResolveGenericTypeAliases(ExpressionContext &ctx, SynBase *source, TypeBase *type, IntrusiveList<MatchData> aliases)
{
	if(!type->isGeneric || aliases.empty())
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(isType<TypeGeneric>(type))
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(type))
	{
		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
				return curr->type;
		}

		return ctx.typeGeneric;
	}

	if(TypeRef *lhs = getType<TypeRef>(type))
		return ctx.GetReferenceType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeArray *lhs = getType<TypeArray>(type))
		return ctx.GetArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases), lhs->length);

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(type))
		return ctx.GetUnsizedArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeFunction *lhs = getType<TypeFunction>(type))
	{
		TypeBase *returnType = ResolveGenericTypeAliases(ctx, source, lhs->returnType, aliases);

		IntrusiveList<TypeHandle> arguments;

		for(TypeHandle *curr = lhs->arguments.head; curr; curr = curr->next)
			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ResolveGenericTypeAliases(ctx, source, curr->type, aliases)));

		return ctx.GetFunctionType(source, returnType, arguments);
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(type))
	{
		bool isGeneric = false;
		IntrusiveList<TypeHandle> types;

		for(TypeHandle *curr = lhs->generics.head; curr; curr = curr->next)
		{
			TypeBase *resolvedType = ResolveGenericTypeAliases(ctx, source, curr->type, aliases);

			if(resolvedType == ctx.typeAuto)
				Stop(ctx, source, "ERROR: 'auto' type cannot be used as template argument");

			isGeneric |= resolvedType->isGeneric;

			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(resolvedType));
		}

		if(isGeneric)
			return ctx.GetGenericClassType(source, lhs->proto, types);

		return CreateGenericTypeInstance(ctx, source, lhs->proto, types);
	}

	Stop(ctx, source, "ERROR: unknown generic type resolve");

	return NULL;
}